

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_2d_sse2.c
# Opt level: O3

void av1_convolve_2d_sr_sse2
               (uint8_t *src,int src_stride,uint8_t *dst,int dst_stride,int w,int h,
               InterpFilterParams *filter_params_x,InterpFilterParams *filter_params_y,
               int subpel_x_qn,int subpel_y_qn,ConvolveParams *conv_params)

{
  int16_t *piVar1;
  undefined2 *puVar2;
  undefined2 *puVar3;
  undefined2 *puVar4;
  undefined2 *puVar5;
  undefined2 *puVar6;
  undefined2 *puVar7;
  undefined8 uVar8;
  ushort uVar9;
  ushort uVar10;
  uint uVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [13];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [11];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  undefined1 auVar59 [15];
  undefined1 auVar60 [15];
  undefined1 auVar61 [15];
  undefined1 auVar62 [15];
  undefined1 auVar63 [15];
  undefined1 auVar64 [15];
  undefined1 auVar65 [15];
  undefined1 auVar66 [15];
  undefined1 auVar67 [15];
  undefined1 auVar68 [15];
  undefined1 auVar69 [15];
  undefined1 auVar70 [15];
  undefined1 auVar71 [15];
  undefined1 auVar72 [15];
  undefined1 auVar73 [15];
  undefined1 auVar74 [15];
  undefined1 auVar75 [15];
  undefined1 auVar76 [15];
  undefined1 auVar77 [15];
  undefined1 auVar78 [15];
  undefined1 auVar79 [15];
  undefined1 auVar80 [15];
  undefined1 auVar81 [15];
  undefined1 auVar82 [15];
  undefined1 auVar83 [15];
  undefined1 auVar84 [15];
  undefined1 auVar85 [15];
  undefined1 auVar86 [15];
  undefined1 auVar87 [15];
  undefined1 auVar88 [15];
  undefined1 auVar89 [15];
  undefined1 auVar90 [15];
  undefined1 auVar91 [15];
  undefined1 auVar92 [15];
  undefined1 auVar93 [15];
  undefined1 auVar94 [15];
  undefined1 auVar95 [15];
  undefined1 auVar96 [15];
  undefined1 auVar97 [15];
  undefined1 auVar98 [15];
  undefined1 auVar99 [15];
  undefined1 auVar100 [15];
  undefined1 auVar101 [15];
  undefined1 auVar102 [15];
  undefined1 auVar103 [15];
  undefined1 auVar104 [15];
  undefined1 auVar105 [15];
  undefined1 auVar106 [15];
  undefined1 auVar107 [15];
  undefined1 auVar108 [15];
  undefined1 auVar109 [15];
  undefined1 auVar110 [15];
  undefined1 auVar111 [15];
  undefined1 auVar112 [15];
  undefined1 auVar113 [15];
  undefined1 auVar114 [15];
  undefined1 auVar115 [15];
  undefined1 auVar116 [15];
  undefined1 auVar117 [15];
  undefined1 auVar118 [15];
  undefined1 auVar119 [15];
  undefined1 auVar120 [15];
  undefined1 auVar121 [15];
  undefined1 auVar122 [15];
  undefined1 auVar123 [15];
  undefined1 auVar124 [15];
  undefined1 auVar125 [15];
  undefined1 auVar126 [15];
  undefined1 auVar127 [15];
  undefined1 auVar128 [15];
  undefined1 auVar129 [15];
  undefined1 auVar130 [15];
  undefined1 auVar131 [15];
  undefined1 auVar132 [15];
  undefined1 auVar133 [15];
  undefined1 auVar134 [15];
  undefined1 auVar135 [15];
  undefined1 auVar136 [15];
  undefined1 auVar137 [15];
  undefined1 auVar138 [15];
  undefined1 auVar139 [15];
  undefined1 auVar140 [15];
  undefined1 auVar141 [15];
  undefined1 auVar142 [15];
  undefined1 auVar143 [15];
  undefined1 auVar144 [15];
  undefined1 auVar145 [15];
  undefined1 auVar146 [15];
  undefined1 auVar147 [15];
  undefined1 auVar148 [15];
  undefined1 auVar149 [15];
  undefined1 auVar150 [15];
  undefined1 auVar151 [15];
  undefined1 auVar152 [15];
  undefined1 auVar153 [15];
  undefined1 auVar154 [15];
  undefined1 auVar155 [15];
  undefined1 auVar156 [15];
  undefined1 auVar157 [15];
  undefined1 auVar158 [15];
  undefined1 auVar159 [15];
  undefined1 auVar160 [15];
  undefined1 auVar161 [15];
  undefined4 uVar162;
  undefined4 uVar163;
  undefined4 uVar164;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [15];
  undefined1 auVar172 [15];
  undefined1 auVar173 [15];
  undefined1 auVar174 [15];
  undefined1 auVar175 [15];
  undefined1 auVar176 [15];
  undefined1 auVar177 [15];
  undefined1 auVar178 [15];
  undefined1 auVar179 [15];
  undefined1 auVar180 [15];
  undefined1 auVar181 [15];
  undefined1 auVar182 [15];
  undefined1 auVar183 [15];
  undefined1 auVar184 [15];
  undefined1 auVar185 [15];
  undefined1 auVar186 [15];
  undefined1 auVar187 [15];
  undefined1 auVar188 [15];
  undefined1 auVar189 [15];
  undefined1 auVar190 [15];
  undefined1 auVar191 [15];
  undefined1 auVar192 [15];
  undefined1 auVar193 [15];
  undefined1 auVar194 [15];
  undefined1 auVar195 [15];
  undefined1 auVar196 [15];
  undefined1 auVar197 [15];
  undefined1 auVar198 [15];
  undefined1 auVar199 [15];
  undefined1 auVar200 [15];
  undefined1 auVar201 [15];
  undefined1 auVar202 [15];
  undefined1 auVar203 [15];
  undefined1 auVar204 [15];
  undefined1 auVar205 [15];
  undefined1 auVar206 [15];
  undefined1 auVar207 [15];
  undefined1 auVar208 [15];
  undefined1 auVar209 [15];
  undefined1 auVar210 [15];
  undefined1 auVar211 [15];
  undefined1 auVar212 [15];
  undefined1 auVar213 [15];
  undefined1 auVar214 [15];
  undefined1 auVar215 [15];
  undefined1 auVar216 [15];
  undefined1 auVar217 [15];
  undefined1 auVar218 [15];
  undefined1 auVar219 [15];
  undefined1 auVar220 [15];
  undefined1 auVar221 [15];
  undefined1 auVar222 [15];
  undefined1 auVar223 [15];
  undefined1 auVar224 [15];
  undefined1 auVar225 [15];
  undefined1 auVar226 [15];
  undefined1 auVar227 [15];
  undefined1 auVar228 [15];
  undefined1 auVar229 [15];
  undefined1 auVar230 [15];
  undefined1 *puVar231;
  byte bVar232;
  byte bVar233;
  undefined1 *puVar234;
  undefined1 *puVar235;
  uint uVar236;
  undefined1 *puVar237;
  undefined1 *puVar238;
  long lVar239;
  uint uVar240;
  int iVar241;
  ulong uVar242;
  uint8_t *puVar243;
  undefined1 *puVar244;
  long lVar245;
  undefined1 *puVar246;
  ulong uVar247;
  undefined1 *puVar248;
  int iVar249;
  ulong uVar250;
  undefined1 *puVar251;
  undefined1 *puVar252;
  undefined1 *puVar253;
  undefined1 *puVar254;
  undefined4 uVar255;
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined4 uVar267;
  undefined1 auVar266 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 uVar278;
  undefined1 uVar279;
  undefined1 uVar280;
  undefined1 uVar281;
  undefined1 uVar282;
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar283 [16];
  undefined1 auVar287 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined2 uVar293;
  undefined1 uVar299;
  undefined1 uVar300;
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 uVar305;
  undefined1 uVar306;
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar316 [16];
  undefined1 auVar318 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar352 [16];
  undefined1 auVar356 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  undefined1 auVar368 [16];
  int16_t im_block [17792];
  ulong local_8be8;
  undefined1 local_8bc8 [16];
  uint local_8bb8;
  undefined1 local_8b38 [1792];
  undefined1 local_8438 [33800];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar284 [16];
  undefined1 auVar288 [16];
  undefined1 auVar285 [16];
  undefined1 auVar289 [16];
  undefined1 auVar286 [16];
  undefined1 auVar290 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 uVar317;
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar332 [16];
  undefined1 auVar337 [16];
  undefined1 auVar333 [16];
  undefined1 auVar338 [16];
  undefined1 auVar334 [16];
  undefined1 auVar339 [16];
  undefined1 uVar342;
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 uVar353;
  undefined1 uVar354;
  undefined1 uVar355;
  undefined1 auVar357 [16];
  undefined1 auVar365 [16];
  undefined1 auVar358 [16];
  undefined1 auVar366 [16];
  undefined1 auVar359 [16];
  undefined1 auVar367 [16];
  undefined1 uVar369;
  undefined1 uVar370;
  
  uVar9 = filter_params_x->taps;
  if (uVar9 < 9) {
    uVar10 = filter_params_y->taps;
    uVar240 = h + -1 + (uint)uVar10;
    uVar11 = conv_params->round_1;
    uVar236 = 0xe - (conv_params->round_0 + uVar11);
    bVar232 = (byte)conv_params->round_0;
    bVar233 = 0x16 - bVar232;
    if (0 < (int)uVar240) {
      puVar243 = src + (-(ulong)(uVar9 >> 1) - (long)(int)(((uVar10 >> 1) - 1) * src_stride)) + 1;
      iVar249 = ((1 << (bVar232 & 0x1f)) >> 1) + 0x4000;
      auVar256 = ZEXT416((uint)conv_params->round_0);
      piVar1 = filter_params_x->filter_ptr + (uint)uVar9 * (subpel_x_qn & 0xfU);
      uVar267 = *(undefined4 *)piVar1;
      uVar162 = *(undefined4 *)(piVar1 + 2);
      uVar163 = *(undefined4 *)(piVar1 + 4);
      uVar164 = *(undefined4 *)(piVar1 + 6);
      auVar303._4_4_ = uVar164;
      auVar303._0_4_ = uVar164;
      auVar303._8_4_ = uVar164;
      auVar303._12_4_ = uVar164;
      auVar262._4_4_ = uVar163;
      auVar262._0_4_ = uVar163;
      auVar262._8_4_ = uVar163;
      auVar262._12_4_ = uVar163;
      auVar297._4_4_ = uVar162;
      auVar297._0_4_ = uVar162;
      auVar297._8_4_ = uVar162;
      auVar297._12_4_ = uVar162;
      auVar323._4_4_ = uVar267;
      auVar323._0_4_ = uVar267;
      auVar323._8_4_ = uVar267;
      auVar323._12_4_ = uVar267;
      puVar237 = local_8b38;
      uVar242 = 0;
      do {
        if (0 < w) {
          lVar239 = 0;
          do {
            auVar328 = *(undefined1 (*) [16])(puVar243 + lVar239);
            uVar282 = auVar328[7];
            auVar20[0xd] = 0;
            auVar20._0_13_ = auVar328._0_13_;
            auVar20[0xe] = uVar282;
            uVar281 = auVar328[6];
            auVar41[0xc] = uVar281;
            auVar41._0_12_ = auVar328._0_12_;
            auVar41._13_2_ = auVar20._13_2_;
            auVar62[0xb] = 0;
            auVar62._0_11_ = auVar328._0_11_;
            auVar62._12_3_ = auVar41._12_3_;
            uVar280 = auVar328[5];
            auVar82[10] = uVar280;
            auVar82._0_10_ = auVar328._0_10_;
            auVar82._11_4_ = auVar62._11_4_;
            auVar102[9] = 0;
            auVar102._0_9_ = auVar328._0_9_;
            auVar102._10_5_ = auVar82._10_5_;
            uVar279 = auVar328[4];
            auVar122[8] = uVar279;
            auVar122._0_8_ = auVar328._0_8_;
            auVar122._9_6_ = auVar102._9_6_;
            auVar171._7_8_ = 0;
            auVar171._0_7_ = auVar122._8_7_;
            uVar278 = auVar328[3];
            auVar191._1_8_ = SUB158(auVar171 << 0x40,7);
            auVar191[0] = uVar278;
            auVar191._9_6_ = 0;
            auVar192._1_10_ = SUB1510(auVar191 << 0x30,5);
            auVar192[0] = auVar328[2];
            auVar192._11_4_ = 0;
            auVar142[2] = auVar328[1];
            auVar142._0_2_ = auVar328._0_2_;
            auVar142._3_12_ = SUB1512(auVar192 << 0x20,3);
            auVar344._0_2_ = auVar328._0_2_ & 0xff;
            auVar344._2_13_ = auVar142._2_13_;
            auVar344[0xf] = 0;
            auVar344 = pmaddwd(auVar344,auVar323);
            uVar300 = auVar328[9];
            auVar21[0xd] = 0;
            auVar21._0_13_ = auVar328._2_13_;
            auVar21[0xe] = uVar300;
            uVar299 = auVar328[8];
            auVar42[0xc] = uVar299;
            auVar42._0_12_ = auVar328._2_12_;
            auVar42._13_2_ = auVar21._13_2_;
            auVar63[0xb] = 0;
            auVar63._0_11_ = auVar328._2_11_;
            auVar63._12_3_ = auVar42._12_3_;
            auVar83[10] = uVar282;
            auVar83._0_10_ = auVar328._2_10_;
            auVar83._11_4_ = auVar63._11_4_;
            auVar103[9] = 0;
            auVar103._0_9_ = auVar328._2_9_;
            auVar103._10_5_ = auVar83._10_5_;
            auVar123[8] = uVar281;
            auVar123._0_8_ = auVar328._2_8_;
            auVar123._9_6_ = auVar103._9_6_;
            auVar172._7_8_ = 0;
            auVar172._0_7_ = auVar123._8_7_;
            auVar193._1_8_ = SUB158(auVar172 << 0x40,7);
            auVar193[0] = uVar280;
            auVar193._9_6_ = 0;
            auVar194._1_10_ = SUB1510(auVar193 << 0x30,5);
            auVar194[0] = uVar279;
            auVar194._11_4_ = 0;
            auVar143[2] = uVar278;
            auVar143._0_2_ = auVar328._2_2_;
            auVar143._3_12_ = SUB1512(auVar194 << 0x20,3);
            auVar362._0_2_ = auVar328._2_2_ & 0xff;
            auVar362._2_13_ = auVar143._2_13_;
            auVar362[0xf] = 0;
            auVar362 = pmaddwd(auVar362,auVar297);
            auVar340._0_12_ = auVar328._4_12_;
            auVar340._12_4_ = auVar328._12_4_;
            uVar306 = auVar328[0xb];
            auVar22[0xd] = 0;
            auVar22._0_13_ = auVar340._0_13_;
            auVar22[0xe] = uVar306;
            uVar305 = auVar328[10];
            auVar43[0xc] = uVar305;
            auVar43._0_12_ = auVar340._0_12_;
            auVar43._13_2_ = auVar22._13_2_;
            auVar64[0xb] = 0;
            auVar64._0_11_ = auVar328._4_11_;
            auVar64._12_3_ = auVar43._12_3_;
            auVar84[10] = uVar300;
            auVar84._0_10_ = auVar328._4_10_;
            auVar84._11_4_ = auVar64._11_4_;
            auVar104[9] = 0;
            auVar104._0_9_ = auVar328._4_9_;
            auVar104._10_5_ = auVar84._10_5_;
            auVar124[8] = uVar299;
            auVar124._0_8_ = auVar328._4_8_;
            auVar124._9_6_ = auVar104._9_6_;
            auVar173._7_8_ = 0;
            auVar173._0_7_ = auVar124._8_7_;
            auVar195._1_8_ = SUB158(auVar173 << 0x40,7);
            auVar195[0] = uVar282;
            auVar195._9_6_ = 0;
            auVar196._1_10_ = SUB1510(auVar195 << 0x30,5);
            auVar196[0] = uVar281;
            auVar196._11_4_ = 0;
            auVar144[2] = uVar280;
            auVar144._0_2_ = auVar328._4_2_;
            auVar144._3_12_ = SUB1512(auVar196 << 0x20,3);
            auVar352._0_2_ = auVar328._4_2_ & 0xff;
            auVar352._2_13_ = auVar144._2_13_;
            auVar352[0xf] = 0;
            auVar316 = pmaddwd(auVar352,auVar262);
            auVar23 = auVar328._3_13_;
            auVar24[0xd] = 0;
            auVar24._0_13_ = auVar23 >> 0x18;
            auVar24[0xe] = auVar328[0xd];
            uVar317 = auVar328[0xc];
            auVar45[0xc] = uVar317;
            auVar45._0_12_ = auVar340._0_12_ >> 0x10;
            auVar45._13_2_ = auVar24._13_2_;
            auVar44 = auVar328._5_11_;
            auVar65[0xb] = 0;
            auVar65._0_11_ = auVar44 >> 8;
            auVar65._12_3_ = auVar45._12_3_;
            auVar85[10] = uVar306;
            auVar85._0_10_ = auVar328._6_10_;
            auVar85._11_4_ = auVar65._11_4_;
            auVar105[9] = 0;
            auVar105._0_9_ = auVar328._6_9_;
            auVar105._10_5_ = auVar85._10_5_;
            auVar125[8] = uVar305;
            auVar125._0_8_ = auVar328._6_8_;
            auVar125._9_6_ = auVar105._9_6_;
            auVar174._7_8_ = 0;
            auVar174._0_7_ = auVar125._8_7_;
            auVar197._1_8_ = SUB158(auVar174 << 0x40,7);
            auVar197[0] = uVar300;
            auVar197._9_6_ = 0;
            auVar198._1_10_ = SUB1510(auVar197 << 0x30,5);
            auVar198[0] = uVar299;
            auVar198._11_4_ = 0;
            auVar145[2] = uVar282;
            auVar145._0_2_ = auVar328._6_2_;
            auVar145._3_12_ = SUB1512(auVar198 << 0x20,3);
            auVar307._0_2_ = auVar328._6_2_ & 0xff;
            auVar307._2_13_ = auVar145._2_13_;
            auVar307[0xf] = 0;
            auVar335 = pmaddwd(auVar307,auVar303);
            auVar346._0_4_ =
                 auVar344._0_4_ + iVar249 + auVar362._0_4_ + auVar335._0_4_ + auVar316._0_4_ >>
                 auVar256;
            auVar346._4_4_ =
                 auVar344._4_4_ + iVar249 + auVar362._4_4_ + auVar335._4_4_ + auVar316._4_4_ >>
                 auVar256;
            auVar346._8_4_ =
                 auVar344._8_4_ + iVar249 + auVar362._8_4_ + auVar335._8_4_ + auVar316._8_4_ >>
                 auVar256;
            auVar346._12_4_ =
                 auVar344._12_4_ + iVar249 + auVar362._12_4_ + auVar335._12_4_ + auVar316._12_4_ >>
                 auVar256;
            auVar25[0xd] = 0;
            auVar25._0_13_ = auVar328._1_13_;
            auVar25[0xe] = uVar299;
            auVar46[0xc] = uVar282;
            auVar46._0_12_ = auVar328._1_12_;
            auVar46._13_2_ = auVar25._13_2_;
            auVar66[0xb] = 0;
            auVar66._0_11_ = auVar328._1_11_;
            auVar66._12_3_ = auVar46._12_3_;
            auVar86[10] = uVar281;
            auVar86._0_10_ = auVar328._1_10_;
            auVar86._11_4_ = auVar66._11_4_;
            auVar106[9] = 0;
            auVar106._0_9_ = auVar328._1_9_;
            auVar106._10_5_ = auVar86._10_5_;
            auVar126[8] = uVar280;
            auVar126._0_8_ = auVar328._1_8_;
            auVar126._9_6_ = auVar106._9_6_;
            auVar175._7_8_ = 0;
            auVar175._0_7_ = auVar126._8_7_;
            auVar199._1_8_ = SUB158(auVar175 << 0x40,7);
            auVar199[0] = uVar279;
            auVar199._9_6_ = 0;
            auVar200._1_10_ = SUB1510(auVar199 << 0x30,5);
            auVar200[0] = uVar278;
            auVar200._11_4_ = 0;
            auVar146[2] = auVar328[2];
            auVar146._0_2_ = auVar328._1_2_;
            auVar146._3_12_ = SUB1512(auVar200 << 0x20,3);
            auVar316._0_2_ = auVar328._1_2_ & 0xff;
            auVar316._2_13_ = auVar146._2_13_;
            auVar316[0xf] = 0;
            auVar344 = pmaddwd(auVar316,auVar323);
            auVar26[0xd] = 0;
            auVar26._0_13_ = auVar23;
            auVar26[0xe] = uVar305;
            auVar47[0xc] = uVar300;
            auVar47._0_12_ = auVar328._3_12_;
            auVar47._13_2_ = auVar26._13_2_;
            auVar67[0xb] = 0;
            auVar67._0_11_ = auVar328._3_11_;
            auVar67._12_3_ = auVar47._12_3_;
            auVar87[10] = uVar299;
            auVar87._0_10_ = auVar328._3_10_;
            auVar87._11_4_ = auVar67._11_4_;
            auVar107[9] = 0;
            auVar107._0_9_ = auVar328._3_9_;
            auVar107._10_5_ = auVar87._10_5_;
            auVar127[8] = uVar282;
            auVar127._0_8_ = auVar328._3_8_;
            auVar127._9_6_ = auVar107._9_6_;
            auVar176._7_8_ = 0;
            auVar176._0_7_ = auVar127._8_7_;
            auVar201._1_8_ = SUB158(auVar176 << 0x40,7);
            auVar201[0] = uVar281;
            auVar201._9_6_ = 0;
            auVar202._1_10_ = SUB1510(auVar201 << 0x30,5);
            auVar202[0] = uVar280;
            auVar202._11_4_ = 0;
            auVar147[2] = uVar279;
            auVar147._0_2_ = auVar328._3_2_;
            auVar147._3_12_ = SUB1512(auVar202 << 0x20,3);
            auVar368._0_2_ = auVar328._3_2_ & 0xff;
            auVar368._2_13_ = auVar147._2_13_;
            auVar368[0xf] = 0;
            auVar362 = pmaddwd(auVar368,auVar297);
            auVar27[0xd] = 0;
            auVar27._0_13_ = auVar23 >> 0x10;
            auVar27[0xe] = uVar317;
            auVar48[0xc] = uVar306;
            auVar48._0_12_ = auVar340._0_12_ >> 8;
            auVar48._13_2_ = auVar27._13_2_;
            auVar68[0xb] = 0;
            auVar68._0_11_ = auVar44;
            auVar68._12_3_ = auVar48._12_3_;
            auVar88[10] = uVar305;
            auVar88._0_10_ = auVar328._5_10_;
            auVar88._11_4_ = auVar68._11_4_;
            auVar108[9] = 0;
            auVar108._0_9_ = auVar328._5_9_;
            auVar108._10_5_ = auVar88._10_5_;
            auVar128[8] = uVar300;
            auVar128._0_8_ = auVar328._5_8_;
            auVar128._9_6_ = auVar108._9_6_;
            auVar177._7_8_ = 0;
            auVar177._0_7_ = auVar128._8_7_;
            auVar203._1_8_ = SUB158(auVar177 << 0x40,7);
            auVar203[0] = uVar299;
            auVar203._9_6_ = 0;
            auVar204._1_10_ = SUB1510(auVar203 << 0x30,5);
            auVar204[0] = uVar282;
            auVar204._11_4_ = 0;
            auVar148[2] = uVar281;
            auVar148._0_2_ = auVar328._5_2_;
            auVar148._3_12_ = SUB1512(auVar204 << 0x20,3);
            auVar308._0_2_ = auVar328._5_2_ & 0xff;
            auVar308._2_13_ = auVar148._2_13_;
            auVar308[0xf] = 0;
            auVar316 = pmaddwd(auVar308,auVar262);
            auVar28[0xd] = 0;
            auVar28._0_13_ = auVar23 >> 0x20;
            auVar28[0xe] = auVar328[0xe];
            auVar49[0xc] = auVar328[0xd];
            auVar49._0_12_ = auVar340._0_12_ >> 0x18;
            auVar49._13_2_ = auVar28._13_2_;
            auVar69[0xb] = 0;
            auVar69._0_11_ = auVar44 >> 0x10;
            auVar69._12_3_ = auVar49._12_3_;
            auVar89[10] = uVar317;
            auVar89._0_10_ = auVar328._6_10_ >> 8;
            auVar89._11_4_ = auVar69._11_4_;
            auVar109[9] = 0;
            auVar109._0_9_ = auVar328._7_9_;
            auVar109._10_5_ = auVar89._10_5_;
            auVar129[8] = uVar306;
            auVar129._0_8_ = auVar328._7_8_;
            auVar129._9_6_ = auVar109._9_6_;
            auVar178._7_8_ = 0;
            auVar178._0_7_ = auVar129._8_7_;
            auVar205._1_8_ = SUB158(auVar178 << 0x40,7);
            auVar205[0] = uVar305;
            auVar205._9_6_ = 0;
            auVar206._1_10_ = SUB1510(auVar205 << 0x30,5);
            auVar206[0] = uVar300;
            auVar206._11_4_ = 0;
            auVar149[2] = uVar299;
            auVar149._0_2_ = auVar328._7_2_;
            auVar149._3_12_ = SUB1512(auVar206 << 0x20,3);
            auVar328._0_2_ = auVar328._7_2_ & 0xff;
            auVar328._2_13_ = auVar149._2_13_;
            auVar328[0xf] = 0;
            auVar328 = pmaddwd(auVar328,auVar303);
            auVar335._0_4_ =
                 auVar344._0_4_ + iVar249 + auVar316._0_4_ + auVar362._0_4_ + auVar328._0_4_ >>
                 auVar256;
            auVar335._4_4_ =
                 auVar344._4_4_ + iVar249 + auVar316._4_4_ + auVar362._4_4_ + auVar328._4_4_ >>
                 auVar256;
            auVar335._8_4_ =
                 auVar344._8_4_ + iVar249 + auVar316._8_4_ + auVar362._8_4_ + auVar328._8_4_ >>
                 auVar256;
            auVar335._12_4_ =
                 auVar344._12_4_ + iVar249 + auVar316._12_4_ + auVar362._12_4_ + auVar328._12_4_ >>
                 auVar256;
            auVar328 = packssdw(auVar346,auVar335);
            *(undefined1 (*) [16])(puVar237 + lVar239 * 2) = auVar328;
            lVar239 = lVar239 + 8;
          } while (lVar239 < w);
        }
        uVar242 = uVar242 + 1;
        puVar243 = puVar243 + src_stride;
        puVar237 = puVar237 + 0x100;
      } while (uVar242 != uVar240);
    }
    local_8bb8 = (uint)uVar10;
    iVar249 = 1 << (bVar233 - (byte)uVar11 & 0x1f);
    if (0 < h) {
      iVar241 = ((1 << ((byte)uVar11 & 0x1f)) >> 1) + (1 << (bVar233 & 0x1f));
      auVar256 = ZEXT416(uVar11);
      iVar249 = ((1 << ((byte)uVar236 & 0x1f)) >> 1) - ((iVar249 >> 1) + iVar249);
      auVar303 = ZEXT416(uVar236);
      piVar1 = filter_params_y->filter_ptr + (subpel_y_qn & 0xfU) * local_8bb8;
      uVar267 = *(undefined4 *)piVar1;
      uVar162 = *(undefined4 *)(piVar1 + 2);
      uVar163 = *(undefined4 *)(piVar1 + 4);
      uVar164 = *(undefined4 *)(piVar1 + 6);
      auVar268._4_4_ = uVar164;
      auVar268._0_4_ = uVar164;
      auVar268._8_4_ = uVar164;
      auVar268._12_4_ = uVar164;
      auVar270._4_4_ = uVar163;
      auVar270._0_4_ = uVar163;
      auVar270._8_4_ = uVar163;
      auVar270._12_4_ = uVar163;
      auVar272._4_4_ = uVar162;
      auVar272._0_4_ = uVar162;
      auVar272._8_4_ = uVar162;
      auVar272._12_4_ = uVar162;
      auVar275._4_4_ = uVar267;
      auVar275._0_4_ = uVar267;
      auVar275._8_4_ = uVar267;
      auVar275._12_4_ = uVar267;
      puVar237 = local_8438;
      uVar242 = 0;
      do {
        if (0 < w) {
          lVar239 = 0;
          do {
            auVar262 = *(undefined1 (*) [16])(puVar237 + lVar239 * 2 + -0x700);
            puVar3 = (undefined2 *)(puVar237 + lVar239 * 2 + -0x600);
            auVar297 = *(undefined1 (*) [16])(puVar237 + lVar239 * 2 + -0x500);
            auVar286._0_12_ = auVar262._0_12_;
            auVar286._12_2_ = auVar262._6_2_;
            auVar286._14_2_ = puVar3[3];
            auVar285._12_4_ = auVar286._12_4_;
            auVar285._0_10_ = auVar262._0_10_;
            auVar285._10_2_ = puVar3[2];
            auVar284._10_6_ = auVar285._10_6_;
            auVar284._0_8_ = auVar262._0_8_;
            auVar284._8_2_ = auVar262._4_2_;
            auVar283._8_8_ = auVar284._8_8_;
            auVar283._6_2_ = puVar3[1];
            auVar283._4_2_ = auVar262._2_2_;
            auVar283._0_2_ = auVar262._0_2_;
            auVar283._2_2_ = *puVar3;
            puVar4 = (undefined2 *)(puVar237 + lVar239 * 2 + -0x400);
            auVar359._0_12_ = auVar297._0_12_;
            auVar359._12_2_ = auVar297._6_2_;
            auVar359._14_2_ = puVar4[3];
            auVar358._12_4_ = auVar359._12_4_;
            auVar358._0_10_ = auVar297._0_10_;
            auVar358._10_2_ = puVar4[2];
            auVar357._10_6_ = auVar358._10_6_;
            auVar357._0_8_ = auVar297._0_8_;
            auVar357._8_2_ = auVar297._4_2_;
            auVar356._8_8_ = auVar357._8_8_;
            auVar356._6_2_ = puVar4[1];
            auVar356._4_2_ = auVar297._2_2_;
            auVar356._0_2_ = auVar297._0_2_;
            auVar356._2_2_ = *puVar4;
            auVar323 = *(undefined1 (*) [16])(puVar237 + lVar239 * 2 + -0x300);
            puVar5 = (undefined2 *)(puVar237 + lVar239 * 2 + -0x200);
            auVar321._0_12_ = auVar323._0_12_;
            auVar321._12_2_ = auVar323._6_2_;
            auVar321._14_2_ = puVar5[3];
            auVar320._12_4_ = auVar321._12_4_;
            auVar320._0_10_ = auVar323._0_10_;
            auVar320._10_2_ = puVar5[2];
            auVar319._10_6_ = auVar320._10_6_;
            auVar319._0_8_ = auVar323._0_8_;
            auVar319._8_2_ = auVar323._4_2_;
            auVar318._8_8_ = auVar319._8_8_;
            auVar318._6_2_ = puVar5[1];
            auVar318._4_2_ = auVar323._2_2_;
            auVar318._0_2_ = auVar323._0_2_;
            auVar318._2_2_ = *puVar5;
            auVar328 = *(undefined1 (*) [16])(puVar237 + lVar239 * 2 + -0x100);
            puVar2 = (undefined2 *)(puVar237 + lVar239 * 2);
            auVar344 = pmaddwd(auVar283,auVar275);
            auVar316 = pmaddwd(auVar356,auVar272);
            auVar290._0_12_ = auVar328._0_12_;
            auVar290._12_2_ = auVar328._6_2_;
            auVar290._14_2_ = puVar2[3];
            auVar289._12_4_ = auVar290._12_4_;
            auVar289._0_10_ = auVar328._0_10_;
            auVar289._10_2_ = puVar2[2];
            auVar288._10_6_ = auVar289._10_6_;
            auVar288._0_8_ = auVar328._0_8_;
            auVar288._8_2_ = auVar328._4_2_;
            auVar287._8_8_ = auVar288._8_8_;
            auVar287._6_2_ = puVar2[1];
            auVar287._4_2_ = auVar328._2_2_;
            auVar287._0_2_ = auVar328._0_2_;
            auVar287._2_2_ = *puVar2;
            auVar362 = pmaddwd(auVar318,auVar270);
            auVar346 = pmaddwd(auVar287,auVar268);
            auVar309._2_2_ = puVar3[4];
            auVar309._0_2_ = auVar262._8_2_;
            auVar309._4_2_ = auVar262._10_2_;
            auVar309._6_2_ = puVar3[5];
            auVar309._8_2_ = auVar262._12_2_;
            auVar309._10_2_ = puVar3[6];
            auVar309._12_2_ = auVar262._14_2_;
            auVar309._14_2_ = puVar3[7];
            auVar294._2_2_ = puVar4[4];
            auVar294._0_2_ = auVar297._8_2_;
            auVar294._4_2_ = auVar297._10_2_;
            auVar294._6_2_ = puVar4[5];
            auVar294._8_2_ = auVar297._12_2_;
            auVar294._10_2_ = puVar4[6];
            auVar294._12_2_ = auVar297._14_2_;
            auVar294._14_2_ = puVar4[7];
            auVar263._2_2_ = puVar5[4];
            auVar263._0_2_ = auVar323._8_2_;
            auVar263._4_2_ = auVar323._10_2_;
            auVar263._6_2_ = puVar5[5];
            auVar263._8_2_ = auVar323._12_2_;
            auVar263._10_2_ = puVar5[6];
            auVar263._12_2_ = auVar323._14_2_;
            auVar263._14_2_ = puVar5[7];
            auVar301._2_2_ = puVar2[4];
            auVar301._0_2_ = auVar328._8_2_;
            auVar301._4_2_ = auVar328._10_2_;
            auVar301._6_2_ = puVar2[5];
            auVar301._8_2_ = auVar328._12_2_;
            auVar301._10_2_ = puVar2[6];
            auVar301._12_2_ = auVar328._14_2_;
            auVar301._14_2_ = puVar2[7];
            auVar328 = pmaddwd(auVar309,auVar275);
            auVar297 = pmaddwd(auVar294,auVar272);
            auVar262 = pmaddwd(auVar263,auVar270);
            auVar323 = pmaddwd(auVar301,auVar268);
            auVar295._0_4_ =
                 (auVar346._0_4_ + auVar362._0_4_ + auVar316._0_4_ + auVar344._0_4_ + iVar241 >>
                 auVar256) + iVar249 >> auVar303;
            auVar295._4_4_ =
                 (auVar323._0_4_ + auVar262._0_4_ + auVar297._0_4_ + auVar328._0_4_ + iVar241 >>
                 auVar256) + iVar249 >> auVar303;
            auVar295._8_4_ =
                 (auVar346._4_4_ + auVar362._4_4_ + auVar316._4_4_ + auVar344._4_4_ + iVar241 >>
                 auVar256) + iVar249 >> auVar303;
            auVar295._12_4_ =
                 (auVar323._4_4_ + auVar262._4_4_ + auVar297._4_4_ + auVar328._4_4_ + iVar241 >>
                 auVar256) + iVar249 >> auVar303;
            auVar291._0_4_ =
                 (auVar346._8_4_ + auVar362._8_4_ + auVar316._8_4_ + auVar344._8_4_ + iVar241 >>
                 auVar256) + iVar249 >> auVar303;
            auVar291._4_4_ =
                 (auVar323._8_4_ + auVar262._8_4_ + auVar297._8_4_ + auVar328._8_4_ + iVar241 >>
                 auVar256) + iVar249 >> auVar303;
            auVar291._8_4_ =
                 (auVar346._12_4_ + auVar362._12_4_ + auVar316._12_4_ + auVar344._12_4_ + iVar241 >>
                 auVar256) + iVar249 >> auVar303;
            auVar291._12_4_ =
                 (auVar323._12_4_ + auVar262._12_4_ + auVar297._12_4_ + auVar328._12_4_ + iVar241 >>
                 auVar256) + iVar249 >> auVar303;
            auVar262 = packssdw(auVar295,auVar291);
            sVar12 = auVar262._0_2_;
            sVar13 = auVar262._2_2_;
            uVar293 = CONCAT11((0 < sVar13) * (sVar13 < 0x100) * auVar262[2] - (0xff < sVar13),
                               (0 < sVar12) * (sVar12 < 0x100) * auVar262[0] - (0xff < sVar12));
            sVar12 = auVar262._4_2_;
            sVar13 = auVar262._6_2_;
            uVar267 = CONCAT13((0 < sVar13) * (sVar13 < 0x100) * auVar262[6] - (0xff < sVar13),
                               CONCAT12((0 < sVar12) * (sVar12 < 0x100) * auVar262[4] -
                                        (0xff < sVar12),uVar293));
            sVar12 = auVar262._8_2_;
            sVar13 = auVar262._10_2_;
            sVar14 = auVar262._12_2_;
            sVar15 = auVar262._14_2_;
            if (w == 4) {
              *(undefined4 *)(dst + lVar239) = uVar267;
            }
            else if (w == 2) {
              *(undefined2 *)(dst + lVar239) = uVar293;
            }
            else {
              *(ulong *)(dst + lVar239) =
                   CONCAT17((0 < sVar15) * (sVar15 < 0x100) * auVar262[0xe] - (0xff < sVar15),
                            CONCAT16((0 < sVar14) * (sVar14 < 0x100) * auVar262[0xc] -
                                     (0xff < sVar14),
                                     CONCAT15((0 < sVar13) * (sVar13 < 0x100) * auVar262[10] -
                                              (0xff < sVar13),
                                              CONCAT14((0 < sVar12) * (sVar12 < 0x100) * auVar262[8]
                                                       - (0xff < sVar12),uVar267))));
            }
            lVar239 = lVar239 + 8;
          } while (lVar239 < w);
        }
        uVar242 = uVar242 + 1;
        dst = dst + dst_stride;
        puVar237 = puVar237 + 0x100;
      } while (uVar242 != (uint)h);
    }
  }
  else {
    if (w < 8) {
      av1_convolve_2d_sr_c
                (src,src_stride,dst,dst_stride,w,h,filter_params_x,filter_params_y,subpel_x_qn,
                 subpel_y_qn,conv_params);
      return;
    }
    uVar11 = conv_params->round_1;
    local_8bc8._0_2_ = filter_params_y->taps;
    uVar236 = h + -1 + (uint)(ushort)local_8bc8._0_2_;
    uVar240 = (0xe - conv_params->round_0) - uVar11;
    bVar232 = (byte)conv_params->round_0;
    bVar233 = 0x16 - bVar232;
    uVar242 = (ulong)(uint)w;
    if (0 < (int)uVar236) {
      auVar256 = ZEXT416((uint)conv_params->round_0);
      iVar249 = ((1 << (bVar232 & 0x1f)) >> 1) + 0x4000;
      uVar247 = (ulong)((subpel_x_qn & 0xfU) * (uint)uVar9);
      uVar8 = *(undefined8 *)(filter_params_x->filter_ptr + uVar247 + 8);
      auVar266._0_4_ = (undefined4)uVar8;
      uVar267 = (undefined4)((ulong)uVar8 >> 0x20);
      auVar265._4_4_ = uVar267;
      auVar265._0_4_ = uVar267;
      auVar265._8_4_ = uVar267;
      auVar265._12_4_ = uVar267;
      auVar266._4_4_ = auVar266._0_4_;
      auVar266._8_4_ = auVar266._0_4_;
      auVar266._12_4_ = auVar266._0_4_;
      piVar1 = filter_params_x->filter_ptr + uVar247;
      uVar267 = *(undefined4 *)piVar1;
      uVar162 = *(undefined4 *)(piVar1 + 2);
      uVar163 = *(undefined4 *)(piVar1 + 4);
      uVar164 = *(undefined4 *)(piVar1 + 6);
      auVar269._4_4_ = uVar164;
      auVar269._0_4_ = uVar164;
      auVar269._8_4_ = uVar164;
      auVar269._12_4_ = uVar164;
      auVar271._4_4_ = uVar163;
      auVar271._0_4_ = uVar163;
      auVar271._8_4_ = uVar163;
      auVar271._12_4_ = uVar163;
      auVar273._4_4_ = uVar162;
      auVar273._0_4_ = uVar162;
      auVar273._8_4_ = uVar162;
      auVar273._12_4_ = uVar162;
      auVar276._4_4_ = uVar267;
      auVar276._0_4_ = uVar267;
      auVar276._8_4_ = uVar267;
      auVar276._12_4_ = uVar267;
      puVar237 = local_8b38;
      lVar239 = 0x400000000;
      uVar247 = 0;
      puVar243 = src + (-(ulong)(uVar9 >> 1) -
                       (long)(int)((((ushort)local_8bc8._0_2_ >> 1) - 1) * src_stride)) + 1;
      do {
        uVar250 = 0;
        lVar245 = lVar239;
        do {
          auVar303 = *(undefined1 (*) [16])(puVar243 + uVar250);
          auVar262 = *(undefined1 (*) [16])
                      (src + (-(ulong)(uVar9 >> 1) -
                             (long)(int)((((ushort)local_8bc8._0_2_ >> 1) - 1) * src_stride)) + 1 +
                      (lVar245 >> 0x20));
          uVar282 = auVar303[7];
          auVar29[0xd] = 0;
          auVar29._0_13_ = auVar303._0_13_;
          auVar29[0xe] = uVar282;
          uVar281 = auVar303[6];
          auVar50[0xc] = uVar281;
          auVar50._0_12_ = auVar303._0_12_;
          auVar50._13_2_ = auVar29._13_2_;
          auVar70[0xb] = 0;
          auVar70._0_11_ = auVar303._0_11_;
          auVar70._12_3_ = auVar50._12_3_;
          uVar280 = auVar303[5];
          auVar90[10] = uVar280;
          auVar90._0_10_ = auVar303._0_10_;
          auVar90._11_4_ = auVar70._11_4_;
          auVar110[9] = 0;
          auVar110._0_9_ = auVar303._0_9_;
          auVar110._10_5_ = auVar90._10_5_;
          uVar279 = auVar303[4];
          auVar130[8] = uVar279;
          auVar130._0_8_ = auVar303._0_8_;
          auVar130._9_6_ = auVar110._9_6_;
          auVar179._7_8_ = 0;
          auVar179._0_7_ = auVar130._8_7_;
          uVar278 = auVar303[3];
          auVar207._1_8_ = SUB158(auVar179 << 0x40,7);
          auVar207[0] = uVar278;
          auVar207._9_6_ = 0;
          auVar208._1_10_ = SUB1510(auVar207 << 0x30,5);
          auVar208[0] = auVar303[2];
          auVar208._11_4_ = 0;
          auVar150[2] = auVar303[1];
          auVar150._0_2_ = auVar303._0_2_;
          auVar150._3_12_ = SUB1512(auVar208 << 0x20,3);
          auVar296._0_2_ = auVar303._0_2_ & 0xff;
          auVar296._2_13_ = auVar150._2_13_;
          auVar296[0xf] = 0;
          auVar297 = pmaddwd(auVar296,auVar276);
          auVar30[0xd] = 0;
          auVar30._0_13_ = auVar303._2_13_;
          auVar30[0xe] = auVar303[9];
          uVar299 = auVar303[8];
          auVar51[0xc] = uVar299;
          auVar51._0_12_ = auVar303._2_12_;
          auVar51._13_2_ = auVar30._13_2_;
          auVar71[0xb] = 0;
          auVar71._0_11_ = auVar303._2_11_;
          auVar71._12_3_ = auVar51._12_3_;
          auVar91[10] = uVar282;
          auVar91._0_10_ = auVar303._2_10_;
          auVar91._11_4_ = auVar71._11_4_;
          auVar111[9] = 0;
          auVar111._0_9_ = auVar303._2_9_;
          auVar111._10_5_ = auVar91._10_5_;
          auVar131[8] = uVar281;
          auVar131._0_8_ = auVar303._2_8_;
          auVar131._9_6_ = auVar111._9_6_;
          auVar180._7_8_ = 0;
          auVar180._0_7_ = auVar131._8_7_;
          auVar209._1_8_ = SUB158(auVar180 << 0x40,7);
          auVar209[0] = uVar280;
          auVar209._9_6_ = 0;
          auVar210._1_10_ = SUB1510(auVar209 << 0x30,5);
          auVar210[0] = uVar279;
          auVar210._11_4_ = 0;
          auVar151[2] = uVar278;
          auVar151._0_2_ = auVar303._2_2_;
          auVar151._3_12_ = SUB1512(auVar210 << 0x20,3);
          auVar322._0_2_ = auVar303._2_2_ & 0xff;
          auVar322._2_13_ = auVar151._2_13_;
          auVar322[0xf] = 0;
          auVar323 = pmaddwd(auVar322,auVar273);
          uVar342 = auVar262[7];
          auVar31[0xd] = 0;
          auVar31._0_13_ = auVar262._0_13_;
          auVar31[0xe] = uVar342;
          uVar317 = auVar262[6];
          auVar52[0xc] = uVar317;
          auVar52._0_12_ = auVar262._0_12_;
          auVar52._13_2_ = auVar31._13_2_;
          auVar72[0xb] = 0;
          auVar72._0_11_ = auVar262._0_11_;
          auVar72._12_3_ = auVar52._12_3_;
          uVar306 = auVar262[5];
          auVar92[10] = uVar306;
          auVar92._0_10_ = auVar262._0_10_;
          auVar92._11_4_ = auVar72._11_4_;
          auVar112[9] = 0;
          auVar112._0_9_ = auVar262._0_9_;
          auVar112._10_5_ = auVar92._10_5_;
          uVar305 = auVar262[4];
          auVar132[8] = uVar305;
          auVar132._0_8_ = auVar262._0_8_;
          auVar132._9_6_ = auVar112._9_6_;
          auVar181._7_8_ = 0;
          auVar181._0_7_ = auVar132._8_7_;
          uVar300 = auVar262[3];
          auVar211._1_8_ = SUB158(auVar181 << 0x40,7);
          auVar211[0] = uVar300;
          auVar211._9_6_ = 0;
          auVar212._1_10_ = SUB1510(auVar211 << 0x30,5);
          auVar212[0] = auVar262[2];
          auVar212._11_4_ = 0;
          auVar152[2] = auVar262[1];
          auVar152._0_2_ = auVar262._0_2_;
          auVar152._3_12_ = SUB1512(auVar212 << 0x20,3);
          auVar327._0_2_ = auVar262._0_2_ & 0xff;
          auVar327._2_13_ = auVar152._2_13_;
          auVar327[0xf] = 0;
          auVar328 = pmaddwd(auVar327,auVar271);
          uVar355 = auVar262[9];
          auVar32[0xd] = 0;
          auVar32._0_13_ = auVar262._2_13_;
          auVar32[0xe] = uVar355;
          uVar353 = auVar262[8];
          auVar53[0xc] = uVar353;
          auVar53._0_12_ = auVar262._2_12_;
          auVar53._13_2_ = auVar32._13_2_;
          auVar73[0xb] = 0;
          auVar73._0_11_ = auVar262._2_11_;
          auVar73._12_3_ = auVar53._12_3_;
          auVar93[10] = uVar342;
          auVar93._0_10_ = auVar262._2_10_;
          auVar93._11_4_ = auVar73._11_4_;
          auVar113[9] = 0;
          auVar113._0_9_ = auVar262._2_9_;
          auVar113._10_5_ = auVar93._10_5_;
          auVar133[8] = uVar317;
          auVar133._0_8_ = auVar262._2_8_;
          auVar133._9_6_ = auVar113._9_6_;
          auVar182._7_8_ = 0;
          auVar182._0_7_ = auVar133._8_7_;
          auVar213._1_8_ = SUB158(auVar182 << 0x40,7);
          auVar213[0] = uVar306;
          auVar213._9_6_ = 0;
          auVar214._1_10_ = SUB1510(auVar213 << 0x30,5);
          auVar214[0] = uVar305;
          auVar214._11_4_ = 0;
          auVar153[2] = uVar300;
          auVar153._0_2_ = auVar262._2_2_;
          auVar153._3_12_ = SUB1512(auVar214 << 0x20,3);
          auVar343._0_2_ = auVar262._2_2_ & 0xff;
          auVar343._2_13_ = auVar153._2_13_;
          auVar343[0xf] = 0;
          auVar344 = pmaddwd(auVar343,auVar269);
          auVar360._0_12_ = auVar262._4_12_;
          auVar360._12_4_ = auVar262._12_4_;
          uVar370 = auVar262[0xb];
          auVar33[0xd] = 0;
          auVar33._0_13_ = auVar360._0_13_;
          auVar33[0xe] = uVar370;
          uVar369 = auVar262[10];
          auVar54[0xc] = uVar369;
          auVar54._0_12_ = auVar360._0_12_;
          auVar54._13_2_ = auVar33._13_2_;
          auVar74[0xb] = 0;
          auVar74._0_11_ = auVar262._4_11_;
          auVar74._12_3_ = auVar54._12_3_;
          auVar94[10] = uVar355;
          auVar94._0_10_ = auVar262._4_10_;
          auVar94._11_4_ = auVar74._11_4_;
          auVar114[9] = 0;
          auVar114._0_9_ = auVar262._4_9_;
          auVar114._10_5_ = auVar94._10_5_;
          auVar134[8] = uVar353;
          auVar134._0_8_ = auVar262._4_8_;
          auVar134._9_6_ = auVar114._9_6_;
          auVar183._7_8_ = 0;
          auVar183._0_7_ = auVar134._8_7_;
          auVar215._1_8_ = SUB158(auVar183 << 0x40,7);
          auVar215[0] = uVar342;
          auVar215._9_6_ = 0;
          auVar216._1_10_ = SUB1510(auVar215 << 0x30,5);
          auVar216[0] = uVar317;
          auVar216._11_4_ = 0;
          auVar154[2] = uVar306;
          auVar154._0_2_ = auVar262._4_2_;
          auVar154._3_12_ = SUB1512(auVar216 << 0x20,3);
          auVar361._0_2_ = auVar262._4_2_ & 0xff;
          auVar361._2_13_ = auVar154._2_13_;
          auVar361[0xf] = 0;
          auVar362 = pmaddwd(auVar361,auVar266);
          auVar23 = auVar262._3_13_;
          auVar34[0xd] = 0;
          auVar34._0_13_ = auVar23 >> 0x18;
          auVar34[0xe] = auVar262[0xd];
          uVar354 = auVar262[0xc];
          auVar55[0xc] = uVar354;
          auVar55._0_12_ = auVar360._0_12_ >> 0x10;
          auVar55._13_2_ = auVar34._13_2_;
          auVar44 = auVar262._5_11_;
          auVar75[0xb] = 0;
          auVar75._0_11_ = auVar44 >> 8;
          auVar75._12_3_ = auVar55._12_3_;
          auVar95[10] = uVar370;
          auVar95._0_10_ = auVar262._6_10_;
          auVar95._11_4_ = auVar75._11_4_;
          auVar115[9] = 0;
          auVar115._0_9_ = auVar262._6_9_;
          auVar115._10_5_ = auVar95._10_5_;
          auVar135[8] = uVar369;
          auVar135._0_8_ = auVar262._6_8_;
          auVar135._9_6_ = auVar115._9_6_;
          auVar184._7_8_ = 0;
          auVar184._0_7_ = auVar135._8_7_;
          auVar217._1_8_ = SUB158(auVar184 << 0x40,7);
          auVar217[0] = uVar355;
          auVar217._9_6_ = 0;
          auVar218._1_10_ = SUB1510(auVar217 << 0x30,5);
          auVar218[0] = uVar353;
          auVar218._11_4_ = 0;
          auVar155[2] = uVar342;
          auVar155._0_2_ = auVar262._6_2_;
          auVar155._3_12_ = SUB1512(auVar218 << 0x20,3);
          auVar345._0_2_ = auVar262._6_2_ & 0xff;
          auVar345._2_13_ = auVar155._2_13_;
          auVar345[0xf] = 0;
          auVar346 = pmaddwd(auVar345,auVar265);
          auVar298._0_4_ =
               auVar297._0_4_ + iVar249 + auVar323._0_4_ + auVar328._0_4_ +
               auVar362._0_4_ + auVar344._0_4_ + auVar346._0_4_ >> auVar256;
          auVar298._4_4_ =
               auVar297._4_4_ + iVar249 + auVar323._4_4_ + auVar328._4_4_ +
               auVar362._4_4_ + auVar344._4_4_ + auVar346._4_4_ >> auVar256;
          auVar298._8_4_ =
               auVar297._8_4_ + iVar249 + auVar323._8_4_ + auVar328._8_4_ +
               auVar362._8_4_ + auVar344._8_4_ + auVar346._8_4_ >> auVar256;
          auVar298._12_4_ =
               auVar297._12_4_ + iVar249 + auVar323._12_4_ + auVar328._12_4_ +
               auVar362._12_4_ + auVar344._12_4_ + auVar346._12_4_ >> auVar256;
          auVar35[0xd] = 0;
          auVar35._0_13_ = auVar303._1_13_;
          auVar35[0xe] = uVar299;
          auVar56[0xc] = uVar282;
          auVar56._0_12_ = auVar303._1_12_;
          auVar56._13_2_ = auVar35._13_2_;
          auVar76[0xb] = 0;
          auVar76._0_11_ = auVar303._1_11_;
          auVar76._12_3_ = auVar56._12_3_;
          auVar96[10] = uVar281;
          auVar96._0_10_ = auVar303._1_10_;
          auVar96._11_4_ = auVar76._11_4_;
          auVar116[9] = 0;
          auVar116._0_9_ = auVar303._1_9_;
          auVar116._10_5_ = auVar96._10_5_;
          auVar136[8] = uVar280;
          auVar136._0_8_ = auVar303._1_8_;
          auVar136._9_6_ = auVar116._9_6_;
          auVar185._7_8_ = 0;
          auVar185._0_7_ = auVar136._8_7_;
          auVar219._1_8_ = SUB158(auVar185 << 0x40,7);
          auVar219[0] = uVar279;
          auVar219._9_6_ = 0;
          auVar220._1_10_ = SUB1510(auVar219 << 0x30,5);
          auVar220[0] = uVar278;
          auVar220._11_4_ = 0;
          auVar156[2] = auVar303[2];
          auVar156._0_2_ = auVar303._1_2_;
          auVar156._3_12_ = SUB1512(auVar220 << 0x20,3);
          auVar324._0_2_ = auVar303._1_2_ & 0xff;
          auVar324._2_13_ = auVar156._2_13_;
          auVar324[0xf] = 0;
          auVar323 = pmaddwd(auVar324,auVar276);
          auVar36[0xd] = 0;
          auVar36._0_13_ = auVar303._3_13_;
          auVar36[0xe] = auVar303[10];
          auVar57[0xc] = auVar303[9];
          auVar57._0_12_ = auVar303._3_12_;
          auVar57._13_2_ = auVar36._13_2_;
          auVar77[0xb] = 0;
          auVar77._0_11_ = auVar303._3_11_;
          auVar77._12_3_ = auVar57._12_3_;
          auVar97[10] = uVar299;
          auVar97._0_10_ = auVar303._3_10_;
          auVar97._11_4_ = auVar77._11_4_;
          auVar117[9] = 0;
          auVar117._0_9_ = auVar303._3_9_;
          auVar117._10_5_ = auVar97._10_5_;
          auVar137[8] = uVar282;
          auVar137._0_8_ = auVar303._3_8_;
          auVar137._9_6_ = auVar117._9_6_;
          auVar186._7_8_ = 0;
          auVar186._0_7_ = auVar137._8_7_;
          auVar221._1_8_ = SUB158(auVar186 << 0x40,7);
          auVar221[0] = uVar281;
          auVar221._9_6_ = 0;
          auVar222._1_10_ = SUB1510(auVar221 << 0x30,5);
          auVar222[0] = uVar280;
          auVar222._11_4_ = 0;
          auVar157[2] = uVar279;
          auVar157._0_2_ = auVar303._3_2_;
          auVar157._3_12_ = SUB1512(auVar222 << 0x20,3);
          auVar310._0_2_ = auVar303._3_2_ & 0xff;
          auVar310._2_13_ = auVar157._2_13_;
          auVar310[0xf] = 0;
          auVar297 = pmaddwd(auVar310,auVar273);
          auVar37[0xd] = 0;
          auVar37._0_13_ = auVar262._1_13_;
          auVar37[0xe] = uVar353;
          auVar58[0xc] = uVar342;
          auVar58._0_12_ = auVar262._1_12_;
          auVar58._13_2_ = auVar37._13_2_;
          auVar78[0xb] = 0;
          auVar78._0_11_ = auVar262._1_11_;
          auVar78._12_3_ = auVar58._12_3_;
          auVar98[10] = uVar317;
          auVar98._0_10_ = auVar262._1_10_;
          auVar98._11_4_ = auVar78._11_4_;
          auVar118[9] = 0;
          auVar118._0_9_ = auVar262._1_9_;
          auVar118._10_5_ = auVar98._10_5_;
          auVar138[8] = uVar306;
          auVar138._0_8_ = auVar262._1_8_;
          auVar138._9_6_ = auVar118._9_6_;
          auVar187._7_8_ = 0;
          auVar187._0_7_ = auVar138._8_7_;
          auVar223._1_8_ = SUB158(auVar187 << 0x40,7);
          auVar223[0] = uVar305;
          auVar223._9_6_ = 0;
          auVar224._1_10_ = SUB1510(auVar223 << 0x30,5);
          auVar224[0] = uVar300;
          auVar224._11_4_ = 0;
          auVar158[2] = auVar262[2];
          auVar158._0_2_ = auVar262._1_2_;
          auVar158._3_12_ = SUB1512(auVar224 << 0x20,3);
          auVar329._0_2_ = auVar262._1_2_ & 0xff;
          auVar329._2_13_ = auVar158._2_13_;
          auVar329[0xf] = 0;
          auVar328 = pmaddwd(auVar329,auVar271);
          auVar38[0xd] = 0;
          auVar38._0_13_ = auVar23;
          auVar38[0xe] = uVar369;
          auVar59[0xc] = uVar355;
          auVar59._0_12_ = auVar262._3_12_;
          auVar59._13_2_ = auVar38._13_2_;
          auVar79[0xb] = 0;
          auVar79._0_11_ = auVar262._3_11_;
          auVar79._12_3_ = auVar59._12_3_;
          auVar99[10] = uVar353;
          auVar99._0_10_ = auVar262._3_10_;
          auVar99._11_4_ = auVar79._11_4_;
          auVar119[9] = 0;
          auVar119._0_9_ = auVar262._3_9_;
          auVar119._10_5_ = auVar99._10_5_;
          auVar139[8] = uVar342;
          auVar139._0_8_ = auVar262._3_8_;
          auVar139._9_6_ = auVar119._9_6_;
          auVar188._7_8_ = 0;
          auVar188._0_7_ = auVar139._8_7_;
          auVar225._1_8_ = SUB158(auVar188 << 0x40,7);
          auVar225[0] = uVar317;
          auVar225._9_6_ = 0;
          auVar226._1_10_ = SUB1510(auVar225 << 0x30,5);
          auVar226[0] = uVar306;
          auVar226._11_4_ = 0;
          auVar159[2] = uVar305;
          auVar159._0_2_ = auVar262._3_2_;
          auVar159._3_12_ = SUB1512(auVar226 << 0x20,3);
          auVar347._0_2_ = auVar262._3_2_ & 0xff;
          auVar347._2_13_ = auVar159._2_13_;
          auVar347[0xf] = 0;
          auVar346 = pmaddwd(auVar347,auVar269);
          auVar39[0xd] = 0;
          auVar39._0_13_ = auVar23 >> 0x10;
          auVar39[0xe] = uVar354;
          auVar60[0xc] = uVar370;
          auVar60._0_12_ = auVar360._0_12_ >> 8;
          auVar60._13_2_ = auVar39._13_2_;
          auVar80[0xb] = 0;
          auVar80._0_11_ = auVar44;
          auVar80._12_3_ = auVar60._12_3_;
          auVar100[10] = uVar369;
          auVar100._0_10_ = auVar262._5_10_;
          auVar100._11_4_ = auVar80._11_4_;
          auVar120[9] = 0;
          auVar120._0_9_ = auVar262._5_9_;
          auVar120._10_5_ = auVar100._10_5_;
          auVar140[8] = uVar355;
          auVar140._0_8_ = auVar262._5_8_;
          auVar140._9_6_ = auVar120._9_6_;
          auVar189._7_8_ = 0;
          auVar189._0_7_ = auVar140._8_7_;
          auVar227._1_8_ = SUB158(auVar189 << 0x40,7);
          auVar227[0] = uVar353;
          auVar227._9_6_ = 0;
          auVar228._1_10_ = SUB1510(auVar227 << 0x30,5);
          auVar228[0] = uVar342;
          auVar228._11_4_ = 0;
          auVar160[2] = uVar317;
          auVar160._0_2_ = auVar262._5_2_;
          auVar160._3_12_ = SUB1512(auVar228 << 0x20,3);
          auVar330._0_2_ = auVar262._5_2_ & 0xff;
          auVar330._2_13_ = auVar160._2_13_;
          auVar330[0xf] = 0;
          auVar344 = pmaddwd(auVar330,auVar266);
          auVar40[0xd] = 0;
          auVar40._0_13_ = auVar23 >> 0x20;
          auVar40[0xe] = auVar262[0xe];
          auVar61[0xc] = auVar262[0xd];
          auVar61._0_12_ = auVar360._0_12_ >> 0x18;
          auVar61._13_2_ = auVar40._13_2_;
          auVar81[0xb] = 0;
          auVar81._0_11_ = auVar44 >> 0x10;
          auVar81._12_3_ = auVar61._12_3_;
          auVar101[10] = uVar354;
          auVar101._0_10_ = auVar262._6_10_ >> 8;
          auVar101._11_4_ = auVar81._11_4_;
          auVar121[9] = 0;
          auVar121._0_9_ = auVar262._7_9_;
          auVar121._10_5_ = auVar101._10_5_;
          auVar141[8] = uVar370;
          auVar141._0_8_ = auVar262._7_8_;
          auVar141._9_6_ = auVar121._9_6_;
          auVar190._7_8_ = 0;
          auVar190._0_7_ = auVar141._8_7_;
          auVar229._1_8_ = SUB158(auVar190 << 0x40,7);
          auVar229[0] = uVar369;
          auVar229._9_6_ = 0;
          auVar230._1_10_ = SUB1510(auVar229 << 0x30,5);
          auVar230[0] = uVar355;
          auVar230._11_4_ = 0;
          auVar161[2] = uVar353;
          auVar161._0_2_ = auVar262._7_2_;
          auVar161._3_12_ = SUB1512(auVar230 << 0x20,3);
          auVar302._0_2_ = auVar262._7_2_ & 0xff;
          auVar302._2_13_ = auVar161._2_13_;
          auVar302[0xf] = 0;
          auVar303 = pmaddwd(auVar302,auVar265);
          auVar325._0_4_ =
               auVar323._0_4_ + iVar249 + auVar297._0_4_ + auVar346._0_4_ + auVar328._0_4_ +
               auVar303._0_4_ + auVar344._0_4_ >> auVar256;
          auVar325._4_4_ =
               auVar323._4_4_ + iVar249 + auVar297._4_4_ + auVar346._4_4_ + auVar328._4_4_ +
               auVar303._4_4_ + auVar344._4_4_ >> auVar256;
          auVar325._8_4_ =
               auVar323._8_4_ + iVar249 + auVar297._8_4_ + auVar346._8_4_ + auVar328._8_4_ +
               auVar303._8_4_ + auVar344._8_4_ >> auVar256;
          auVar325._12_4_ =
               auVar323._12_4_ + iVar249 + auVar297._12_4_ + auVar346._12_4_ + auVar328._12_4_ +
               auVar303._12_4_ + auVar344._12_4_ >> auVar256;
          auVar303 = packssdw(auVar298,auVar325);
          *(undefined1 (*) [16])(puVar237 + uVar250 * 2) = auVar303;
          uVar250 = uVar250 + 8;
          lVar245 = lVar245 + 0x800000000;
        } while (uVar250 < uVar242);
        uVar247 = uVar247 + 1;
        puVar237 = puVar237 + uVar242 * 2;
        lVar239 = lVar239 + ((long)src_stride << 0x20);
        puVar243 = puVar243 + src_stride;
      } while (uVar247 != uVar236);
    }
    iVar249 = 1 << (bVar233 - (byte)uVar11 & 0x1f);
    if (0 < h) {
      iVar241 = ((1 << ((byte)uVar11 & 0x1f)) >> 1) + (1 << (bVar233 & 0x1f));
      auVar256 = ZEXT416(uVar11);
      iVar249 = ((1 << ((byte)uVar240 & 0x1f)) >> 1) - ((iVar249 >> 1) + iVar249);
      auVar303 = ZEXT416(uVar240);
      local_8bc8._2_2_ = 0;
      uVar247 = (ulong)((subpel_y_qn & 0xfU) * local_8bc8._0_4_);
      uVar8 = *(undefined8 *)(filter_params_y->filter_ptr + uVar247 + 8);
      uVar255 = (undefined4)uVar8;
      local_8bc8._4_4_ = (undefined4)((ulong)uVar8 >> 0x20);
      piVar1 = filter_params_y->filter_ptr + uVar247;
      uVar267 = *(undefined4 *)piVar1;
      uVar162 = *(undefined4 *)(piVar1 + 2);
      uVar163 = *(undefined4 *)(piVar1 + 4);
      uVar164 = *(undefined4 *)(piVar1 + 6);
      auVar311._4_4_ = uVar164;
      auVar311._0_4_ = uVar164;
      auVar311._8_4_ = uVar164;
      auVar311._12_4_ = uVar164;
      auVar363._4_4_ = uVar267;
      auVar363._0_4_ = uVar267;
      auVar363._8_4_ = uVar267;
      auVar363._12_4_ = uVar267;
      puVar234 = local_8b38 + (ulong)(uint)(w * 8) * 2;
      puVar244 = local_8b38 + (ulong)(uint)(w * 0xb) * 2;
      lVar239 = uVar242 * 2;
      puVar246 = local_8b38 + (ulong)(uint)(w * 10) * 2;
      puVar248 = local_8b38 + (ulong)(uint)(w * 9) * 2;
      puVar251 = local_8b38 + (ulong)(uint)(w * 7) * 2;
      puVar235 = local_8b38 + (ulong)(uint)(w * 6) * 2;
      puVar254 = local_8b38 + (ulong)(uint)(w * 5) * 2;
      puVar252 = local_8b38 + (ulong)(uint)(w * 4) * 2;
      puVar253 = local_8b38 + (ulong)(uint)(w * 3) * 2;
      puVar238 = local_8b38 + (ulong)(uint)(w * 2) * 2;
      puVar231 = local_8b38 + uVar242 * 2;
      puVar237 = local_8b38;
      local_8be8 = 0;
      local_8bc8._0_4_ = local_8bc8._4_4_;
      local_8bc8._8_4_ = local_8bc8._4_4_;
      local_8bc8._12_4_ = local_8bc8._4_4_;
      do {
        uVar247 = 0;
        do {
          auVar262 = *(undefined1 (*) [16])(puVar237 + uVar247 * 2);
          puVar2 = (undefined2 *)(puVar231 + uVar247 * 2);
          auVar260._0_12_ = auVar262._0_12_;
          auVar260._12_2_ = auVar262._6_2_;
          auVar260._14_2_ = puVar2[3];
          auVar259._12_4_ = auVar260._12_4_;
          auVar259._0_10_ = auVar262._0_10_;
          auVar259._10_2_ = puVar2[2];
          auVar258._10_6_ = auVar259._10_6_;
          auVar258._0_8_ = auVar262._0_8_;
          auVar258._8_2_ = auVar262._4_2_;
          auVar257._8_8_ = auVar258._8_8_;
          auVar257._6_2_ = puVar2[1];
          auVar257._4_2_ = auVar262._2_2_;
          auVar257._0_2_ = auVar262._0_2_;
          auVar257._2_2_ = *puVar2;
          auVar297 = *(undefined1 (*) [16])(puVar238 + uVar247 * 2);
          puVar7 = (undefined2 *)(puVar253 + uVar247 * 2);
          auVar334._0_12_ = auVar297._0_12_;
          auVar334._12_2_ = auVar297._6_2_;
          auVar334._14_2_ = puVar7[3];
          auVar333._12_4_ = auVar334._12_4_;
          auVar333._0_10_ = auVar297._0_10_;
          auVar333._10_2_ = puVar7[2];
          auVar332._10_6_ = auVar333._10_6_;
          auVar332._0_8_ = auVar297._0_8_;
          auVar332._8_2_ = auVar297._4_2_;
          auVar331._8_8_ = auVar332._8_8_;
          auVar331._6_2_ = puVar7[1];
          auVar331._4_2_ = auVar297._2_2_;
          auVar331._0_2_ = auVar297._0_2_;
          auVar331._2_2_ = *puVar7;
          auVar323 = *(undefined1 (*) [16])(puVar252 + uVar247 * 2);
          puVar3 = (undefined2 *)(puVar254 + uVar247 * 2);
          auVar351._0_12_ = auVar323._0_12_;
          auVar351._12_2_ = auVar323._6_2_;
          auVar351._14_2_ = puVar3[3];
          auVar350._12_4_ = auVar351._12_4_;
          auVar350._0_10_ = auVar323._0_10_;
          auVar350._10_2_ = puVar3[2];
          auVar349._10_6_ = auVar350._10_6_;
          auVar349._0_8_ = auVar323._0_8_;
          auVar349._8_2_ = auVar323._4_2_;
          auVar348._8_8_ = auVar349._8_8_;
          auVar348._6_2_ = puVar3[1];
          auVar348._4_2_ = auVar323._2_2_;
          auVar348._0_2_ = auVar323._0_2_;
          auVar348._2_2_ = *puVar3;
          auVar328 = *(undefined1 (*) [16])(puVar235 + uVar247 * 2);
          puVar4 = (undefined2 *)(puVar251 + uVar247 * 2);
          auVar315._0_12_ = auVar328._0_12_;
          auVar315._12_2_ = auVar328._6_2_;
          auVar315._14_2_ = puVar4[3];
          auVar314._12_4_ = auVar315._12_4_;
          auVar314._0_10_ = auVar328._0_10_;
          auVar314._10_2_ = puVar4[2];
          auVar313._10_6_ = auVar314._10_6_;
          auVar313._0_8_ = auVar328._0_8_;
          auVar313._8_2_ = auVar328._4_2_;
          auVar312._8_8_ = auVar313._8_8_;
          auVar312._6_2_ = puVar4[1];
          auVar312._4_2_ = auVar328._2_2_;
          auVar312._0_2_ = auVar328._0_2_;
          auVar312._2_2_ = *puVar4;
          auVar344 = *(undefined1 (*) [16])(puVar234 + uVar247 * 2);
          puVar5 = (undefined2 *)(puVar248 + uVar247 * 2);
          auVar367._0_12_ = auVar344._0_12_;
          auVar367._12_2_ = auVar344._6_2_;
          auVar367._14_2_ = puVar5[3];
          auVar366._12_4_ = auVar367._12_4_;
          auVar366._0_10_ = auVar344._0_10_;
          auVar366._10_2_ = puVar5[2];
          auVar365._10_6_ = auVar366._10_6_;
          auVar365._0_8_ = auVar344._0_8_;
          auVar365._8_2_ = auVar344._4_2_;
          auVar364._8_8_ = auVar365._8_8_;
          auVar364._6_2_ = puVar5[1];
          auVar364._4_2_ = auVar344._2_2_;
          auVar364._0_2_ = auVar344._0_2_;
          auVar364._2_2_ = *puVar5;
          auVar362 = pmaddwd(auVar257,auVar363);
          auVar165._4_4_ = uVar162;
          auVar165._0_4_ = uVar162;
          auVar165._8_4_ = uVar162;
          auVar165._12_4_ = uVar162;
          auVar335 = pmaddwd(auVar331,auVar165);
          auVar346 = *(undefined1 (*) [16])(puVar246 + uVar247 * 2);
          auVar167._4_4_ = uVar163;
          auVar167._0_4_ = uVar163;
          auVar167._8_4_ = uVar163;
          auVar167._12_4_ = uVar163;
          auVar352 = pmaddwd(auVar348,auVar167);
          auVar316 = pmaddwd(auVar312,auVar311);
          puVar6 = (undefined2 *)(puVar244 + uVar247 * 2);
          auVar339._0_12_ = auVar346._0_12_;
          auVar339._12_2_ = auVar346._6_2_;
          auVar339._14_2_ = puVar6[3];
          auVar338._12_4_ = auVar339._12_4_;
          auVar338._0_10_ = auVar346._0_10_;
          auVar338._10_2_ = puVar6[2];
          auVar337._10_6_ = auVar338._10_6_;
          auVar337._0_8_ = auVar346._0_8_;
          auVar337._8_2_ = auVar346._4_2_;
          auVar336._8_8_ = auVar337._8_8_;
          auVar336._6_2_ = puVar6[1];
          auVar336._4_2_ = auVar346._2_2_;
          auVar336._0_2_ = auVar346._0_2_;
          auVar336._2_2_ = *puVar6;
          auVar169._4_4_ = uVar255;
          auVar169._0_4_ = uVar255;
          auVar169._8_4_ = uVar255;
          auVar169._12_4_ = uVar255;
          auVar368 = pmaddwd(auVar364,auVar169);
          auVar340 = pmaddwd(auVar336,local_8bc8);
          auVar326._2_2_ = puVar2[4];
          auVar326._0_2_ = auVar262._8_2_;
          auVar326._4_2_ = auVar262._10_2_;
          auVar326._6_2_ = puVar2[5];
          auVar326._8_2_ = auVar262._12_2_;
          auVar326._10_2_ = puVar2[6];
          auVar326._12_2_ = auVar262._14_2_;
          auVar326._14_2_ = puVar2[7];
          auVar304._2_2_ = puVar7[4];
          auVar304._0_2_ = auVar297._8_2_;
          auVar304._4_2_ = auVar297._10_2_;
          auVar304._6_2_ = puVar7[5];
          auVar304._8_2_ = auVar297._12_2_;
          auVar304._10_2_ = puVar7[6];
          auVar304._12_2_ = auVar297._14_2_;
          auVar304._14_2_ = puVar7[7];
          auVar277._2_2_ = puVar3[4];
          auVar277._0_2_ = auVar323._8_2_;
          auVar277._4_2_ = auVar323._10_2_;
          auVar277._6_2_ = puVar3[5];
          auVar277._8_2_ = auVar323._12_2_;
          auVar277._10_2_ = puVar3[6];
          auVar277._12_2_ = auVar323._14_2_;
          auVar277._14_2_ = puVar3[7];
          auVar274._2_2_ = puVar4[4];
          auVar274._0_2_ = auVar328._8_2_;
          auVar274._4_2_ = auVar328._10_2_;
          auVar274._6_2_ = puVar4[5];
          auVar274._8_2_ = auVar328._12_2_;
          auVar274._10_2_ = puVar4[6];
          auVar274._12_2_ = auVar328._14_2_;
          auVar274._14_2_ = puVar4[7];
          auVar292._2_2_ = puVar5[4];
          auVar292._0_2_ = auVar344._8_2_;
          auVar292._4_2_ = auVar344._10_2_;
          auVar292._6_2_ = puVar5[5];
          auVar292._8_2_ = auVar344._12_2_;
          auVar292._10_2_ = puVar5[6];
          auVar292._12_2_ = auVar344._14_2_;
          auVar292._14_2_ = puVar5[7];
          auVar261._2_2_ = puVar6[4];
          auVar261._0_2_ = auVar346._8_2_;
          auVar261._4_2_ = auVar346._10_2_;
          auVar261._6_2_ = puVar6[5];
          auVar261._8_2_ = auVar346._12_2_;
          auVar261._10_2_ = puVar6[6];
          auVar261._12_2_ = auVar346._14_2_;
          auVar261._14_2_ = puVar6[7];
          auVar166._4_4_ = uVar162;
          auVar166._0_4_ = uVar162;
          auVar166._8_4_ = uVar162;
          auVar166._12_4_ = uVar162;
          auVar346 = pmaddwd(auVar326,auVar363);
          auVar344 = pmaddwd(auVar304,auVar166);
          auVar168._4_4_ = uVar163;
          auVar168._0_4_ = uVar163;
          auVar168._8_4_ = uVar163;
          auVar168._12_4_ = uVar163;
          auVar323 = pmaddwd(auVar277,auVar168);
          auVar297 = pmaddwd(auVar274,auVar311);
          auVar170._4_4_ = uVar255;
          auVar170._0_4_ = uVar255;
          auVar170._8_4_ = uVar255;
          auVar170._12_4_ = uVar255;
          auVar328 = pmaddwd(auVar292,auVar170);
          auVar262 = pmaddwd(auVar261,local_8bc8);
          auVar264._0_4_ =
               (auVar340._0_4_ + auVar368._0_4_ +
                auVar316._0_4_ + auVar352._0_4_ + auVar335._0_4_ + auVar362._0_4_ + iVar241 >>
               auVar256) + iVar249 >> auVar303;
          auVar264._4_4_ =
               (auVar262._0_4_ + auVar328._0_4_ +
                auVar297._0_4_ + auVar323._0_4_ + auVar344._0_4_ + auVar346._0_4_ + iVar241 >>
               auVar256) + iVar249 >> auVar303;
          auVar264._8_4_ =
               (auVar340._4_4_ + auVar368._4_4_ +
                auVar316._4_4_ + auVar352._4_4_ + auVar335._4_4_ + auVar362._4_4_ + iVar241 >>
               auVar256) + iVar249 >> auVar303;
          auVar264._12_4_ =
               (auVar262._4_4_ + auVar328._4_4_ +
                auVar297._4_4_ + auVar323._4_4_ + auVar344._4_4_ + auVar346._4_4_ + iVar241 >>
               auVar256) + iVar249 >> auVar303;
          auVar341._0_4_ =
               (auVar340._8_4_ + auVar368._8_4_ +
                auVar316._8_4_ + auVar352._8_4_ + auVar335._8_4_ + auVar362._8_4_ + iVar241 >>
               auVar256) + iVar249 >> auVar303;
          auVar341._4_4_ =
               (auVar262._8_4_ + auVar328._8_4_ +
                auVar297._8_4_ + auVar323._8_4_ + auVar344._8_4_ + auVar346._8_4_ + iVar241 >>
               auVar256) + iVar249 >> auVar303;
          auVar341._8_4_ =
               (auVar340._12_4_ + auVar368._12_4_ +
                auVar316._12_4_ + auVar352._12_4_ + auVar335._12_4_ + auVar362._12_4_ + iVar241 >>
               auVar256) + iVar249 >> auVar303;
          auVar341._12_4_ =
               (auVar262._12_4_ + auVar328._12_4_ +
                auVar297._12_4_ + auVar323._12_4_ + auVar344._12_4_ + auVar346._12_4_ + iVar241 >>
               auVar256) + iVar249 >> auVar303;
          auVar262 = packssdw(auVar264,auVar341);
          sVar12 = auVar262._0_2_;
          sVar13 = auVar262._2_2_;
          sVar14 = auVar262._4_2_;
          sVar15 = auVar262._6_2_;
          sVar16 = auVar262._8_2_;
          sVar17 = auVar262._10_2_;
          sVar18 = auVar262._12_2_;
          sVar19 = auVar262._14_2_;
          *(ulong *)(dst + uVar247) =
               CONCAT17((0 < sVar19) * (sVar19 < 0x100) * auVar262[0xe] - (0xff < sVar19),
                        CONCAT16((0 < sVar18) * (sVar18 < 0x100) * auVar262[0xc] - (0xff < sVar18),
                                 CONCAT15((0 < sVar17) * (sVar17 < 0x100) * auVar262[10] -
                                          (0xff < sVar17),
                                          CONCAT14((0 < sVar16) * (sVar16 < 0x100) * auVar262[8] -
                                                   (0xff < sVar16),
                                                   CONCAT13((0 < sVar15) * (sVar15 < 0x100) *
                                                            auVar262[6] - (0xff < sVar15),
                                                            CONCAT12((0 < sVar14) * (sVar14 < 0x100)
                                                                     * auVar262[4] - (0xff < sVar14)
                                                                     ,CONCAT11((0 < sVar13) *
                                                                               (sVar13 < 0x100) *
                                                                               auVar262[2] -
                                                                               (0xff < sVar13),
                                                                               (0 < sVar12) *
                                                                               (sVar12 < 0x100) *
                                                                               auVar262[0] -
                                                                               (0xff < sVar12)))))))
                       );
          uVar247 = uVar247 + 8;
        } while (uVar247 < uVar242);
        local_8be8 = local_8be8 + 1;
        dst = dst + dst_stride;
        puVar244 = puVar244 + lVar239;
        puVar246 = puVar246 + lVar239;
        puVar248 = puVar248 + lVar239;
        puVar234 = puVar234 + lVar239;
        puVar251 = puVar251 + lVar239;
        puVar235 = puVar235 + lVar239;
        puVar254 = puVar254 + lVar239;
        puVar252 = puVar252 + lVar239;
        puVar253 = puVar253 + lVar239;
        puVar238 = puVar238 + lVar239;
        puVar231 = puVar231 + lVar239;
        puVar237 = puVar237 + lVar239;
      } while (local_8be8 != (uint)h);
    }
  }
  return;
}

Assistant:

void av1_convolve_2d_sr_sse2(const uint8_t *src, int src_stride, uint8_t *dst,
                             int dst_stride, int w, int h,
                             const InterpFilterParams *filter_params_x,
                             const InterpFilterParams *filter_params_y,
                             const int subpel_x_qn, const int subpel_y_qn,
                             ConvolveParams *conv_params) {
  if (filter_params_x->taps > 8) {
    if (w < 8) {
      av1_convolve_2d_sr_c(src, src_stride, dst, dst_stride, w, h,
                           filter_params_x, filter_params_y, subpel_x_qn,
                           subpel_y_qn, conv_params);
    } else {
      convolve_2d_sr_12tap_sse2(src, src_stride, dst, dst_stride, w, h,
                                filter_params_x, filter_params_y, subpel_x_qn,
                                subpel_y_qn, conv_params);
    }
  } else {
    const int bd = 8;

    DECLARE_ALIGNED(16, int16_t,
                    im_block[(MAX_SB_SIZE + MAX_FILTER_TAP - 1) * MAX_SB_SIZE]);
    int im_h = h + filter_params_y->taps - 1;
    int im_stride = MAX_SB_SIZE;
    int i, j;
    const int fo_vert = filter_params_y->taps / 2 - 1;
    const int fo_horiz = filter_params_x->taps / 2 - 1;
    const uint8_t *const src_ptr = src - fo_vert * src_stride - fo_horiz;

    const __m128i zero = _mm_setzero_si128();
    const int bits =
        FILTER_BITS * 2 - conv_params->round_0 - conv_params->round_1;
    const int offset_bits = bd + 2 * FILTER_BITS - conv_params->round_0;

    assert(conv_params->round_0 > 0);

    /* Horizontal filter */
    {
      const int16_t *x_filter = av1_get_interp_filter_subpel_kernel(
          filter_params_x, subpel_x_qn & SUBPEL_MASK);
      const __m128i coeffs_x = _mm_loadu_si128((__m128i *)x_filter);

      // coeffs 0 1 0 1 2 3 2 3
      const __m128i tmp_0 = _mm_unpacklo_epi32(coeffs_x, coeffs_x);
      // coeffs 4 5 4 5 6 7 6 7
      const __m128i tmp_1 = _mm_unpackhi_epi32(coeffs_x, coeffs_x);

      // coeffs 0 1 0 1 0 1 0 1
      const __m128i coeff_01 = _mm_unpacklo_epi64(tmp_0, tmp_0);
      // coeffs 2 3 2 3 2 3 2 3
      const __m128i coeff_23 = _mm_unpackhi_epi64(tmp_0, tmp_0);
      // coeffs 4 5 4 5 4 5 4 5
      const __m128i coeff_45 = _mm_unpacklo_epi64(tmp_1, tmp_1);
      // coeffs 6 7 6 7 6 7 6 7
      const __m128i coeff_67 = _mm_unpackhi_epi64(tmp_1, tmp_1);

      const __m128i round_const = _mm_set1_epi32(
          (1 << (bd + FILTER_BITS - 1)) + ((1 << conv_params->round_0) >> 1));
      const __m128i round_shift = _mm_cvtsi32_si128(conv_params->round_0);

      for (i = 0; i < im_h; ++i) {
        for (j = 0; j < w; j += 8) {
          const __m128i data =
              _mm_loadu_si128((__m128i *)&src_ptr[i * src_stride + j]);

          // Filter even-index pixels
          const __m128i src_0 = _mm_unpacklo_epi8(data, zero);
          const __m128i res_0 = _mm_madd_epi16(src_0, coeff_01);
          const __m128i src_2 =
              _mm_unpacklo_epi8(_mm_srli_si128(data, 2), zero);
          const __m128i res_2 = _mm_madd_epi16(src_2, coeff_23);
          const __m128i src_4 =
              _mm_unpacklo_epi8(_mm_srli_si128(data, 4), zero);
          const __m128i res_4 = _mm_madd_epi16(src_4, coeff_45);
          const __m128i src_6 =
              _mm_unpacklo_epi8(_mm_srli_si128(data, 6), zero);
          const __m128i res_6 = _mm_madd_epi16(src_6, coeff_67);

          __m128i res_even = _mm_add_epi32(_mm_add_epi32(res_0, res_4),
                                           _mm_add_epi32(res_2, res_6));
          res_even =
              _mm_sra_epi32(_mm_add_epi32(res_even, round_const), round_shift);

          // Filter odd-index pixels
          const __m128i src_1 =
              _mm_unpacklo_epi8(_mm_srli_si128(data, 1), zero);
          const __m128i res_1 = _mm_madd_epi16(src_1, coeff_01);
          const __m128i src_3 =
              _mm_unpacklo_epi8(_mm_srli_si128(data, 3), zero);
          const __m128i res_3 = _mm_madd_epi16(src_3, coeff_23);
          const __m128i src_5 =
              _mm_unpacklo_epi8(_mm_srli_si128(data, 5), zero);
          const __m128i res_5 = _mm_madd_epi16(src_5, coeff_45);
          const __m128i src_7 =
              _mm_unpacklo_epi8(_mm_srli_si128(data, 7), zero);
          const __m128i res_7 = _mm_madd_epi16(src_7, coeff_67);

          __m128i res_odd = _mm_add_epi32(_mm_add_epi32(res_1, res_5),
                                          _mm_add_epi32(res_3, res_7));
          res_odd =
              _mm_sra_epi32(_mm_add_epi32(res_odd, round_const), round_shift);

          // Pack in the column order 0, 2, 4, 6, 1, 3, 5, 7
          __m128i res = _mm_packs_epi32(res_even, res_odd);
          _mm_storeu_si128((__m128i *)&im_block[i * im_stride + j], res);
        }
      }
    }

    /* Vertical filter */
    {
      const int16_t *y_filter = av1_get_interp_filter_subpel_kernel(
          filter_params_y, subpel_y_qn & SUBPEL_MASK);
      const __m128i coeffs_y = _mm_loadu_si128((__m128i *)y_filter);

      // coeffs 0 1 0 1 2 3 2 3
      const __m128i tmp_0 = _mm_unpacklo_epi32(coeffs_y, coeffs_y);
      // coeffs 4 5 4 5 6 7 6 7
      const __m128i tmp_1 = _mm_unpackhi_epi32(coeffs_y, coeffs_y);

      // coeffs 0 1 0 1 0 1 0 1
      const __m128i coeff_01 = _mm_unpacklo_epi64(tmp_0, tmp_0);
      // coeffs 2 3 2 3 2 3 2 3
      const __m128i coeff_23 = _mm_unpackhi_epi64(tmp_0, tmp_0);
      // coeffs 4 5 4 5 4 5 4 5
      const __m128i coeff_45 = _mm_unpacklo_epi64(tmp_1, tmp_1);
      // coeffs 6 7 6 7 6 7 6 7
      const __m128i coeff_67 = _mm_unpackhi_epi64(tmp_1, tmp_1);

      const __m128i sum_round = _mm_set1_epi32(
          (1 << offset_bits) + ((1 << conv_params->round_1) >> 1));
      const __m128i sum_shift = _mm_cvtsi32_si128(conv_params->round_1);

      const __m128i round_const = _mm_set1_epi32(
          ((1 << bits) >> 1) - (1 << (offset_bits - conv_params->round_1)) -
          ((1 << (offset_bits - conv_params->round_1)) >> 1));
      const __m128i round_shift = _mm_cvtsi32_si128(bits);

      for (i = 0; i < h; ++i) {
        for (j = 0; j < w; j += 8) {
          // Filter even-index pixels
          const int16_t *data = &im_block[i * im_stride + j];
          const __m128i src_0 =
              _mm_unpacklo_epi16(*(__m128i *)(data + 0 * im_stride),
                                 *(__m128i *)(data + 1 * im_stride));
          const __m128i src_2 =
              _mm_unpacklo_epi16(*(__m128i *)(data + 2 * im_stride),
                                 *(__m128i *)(data + 3 * im_stride));
          const __m128i src_4 =
              _mm_unpacklo_epi16(*(__m128i *)(data + 4 * im_stride),
                                 *(__m128i *)(data + 5 * im_stride));
          const __m128i src_6 =
              _mm_unpacklo_epi16(*(__m128i *)(data + 6 * im_stride),
                                 *(__m128i *)(data + 7 * im_stride));

          const __m128i res_0 = _mm_madd_epi16(src_0, coeff_01);
          const __m128i res_2 = _mm_madd_epi16(src_2, coeff_23);
          const __m128i res_4 = _mm_madd_epi16(src_4, coeff_45);
          const __m128i res_6 = _mm_madd_epi16(src_6, coeff_67);

          const __m128i res_even = _mm_add_epi32(_mm_add_epi32(res_0, res_2),
                                                 _mm_add_epi32(res_4, res_6));

          // Filter odd-index pixels
          const __m128i src_1 =
              _mm_unpackhi_epi16(*(__m128i *)(data + 0 * im_stride),
                                 *(__m128i *)(data + 1 * im_stride));
          const __m128i src_3 =
              _mm_unpackhi_epi16(*(__m128i *)(data + 2 * im_stride),
                                 *(__m128i *)(data + 3 * im_stride));
          const __m128i src_5 =
              _mm_unpackhi_epi16(*(__m128i *)(data + 4 * im_stride),
                                 *(__m128i *)(data + 5 * im_stride));
          const __m128i src_7 =
              _mm_unpackhi_epi16(*(__m128i *)(data + 6 * im_stride),
                                 *(__m128i *)(data + 7 * im_stride));

          const __m128i res_1 = _mm_madd_epi16(src_1, coeff_01);
          const __m128i res_3 = _mm_madd_epi16(src_3, coeff_23);
          const __m128i res_5 = _mm_madd_epi16(src_5, coeff_45);
          const __m128i res_7 = _mm_madd_epi16(src_7, coeff_67);

          const __m128i res_odd = _mm_add_epi32(_mm_add_epi32(res_1, res_3),
                                                _mm_add_epi32(res_5, res_7));

          // Rearrange pixels back into the order 0 ... 7
          const __m128i res_lo = _mm_unpacklo_epi32(res_even, res_odd);
          const __m128i res_hi = _mm_unpackhi_epi32(res_even, res_odd);

          __m128i res_lo_round =
              _mm_sra_epi32(_mm_add_epi32(res_lo, sum_round), sum_shift);
          __m128i res_hi_round =
              _mm_sra_epi32(_mm_add_epi32(res_hi, sum_round), sum_shift);

          res_lo_round = _mm_sra_epi32(_mm_add_epi32(res_lo_round, round_const),
                                       round_shift);
          res_hi_round = _mm_sra_epi32(_mm_add_epi32(res_hi_round, round_const),
                                       round_shift);

          const __m128i res16 = _mm_packs_epi32(res_lo_round, res_hi_round);
          const __m128i res = _mm_packus_epi16(res16, res16);

          // Accumulate values into the destination buffer
          __m128i *const p = (__m128i *)&dst[i * dst_stride + j];

          if (w == 2) {
            *(uint16_t *)p = (uint16_t)_mm_cvtsi128_si32(res);
          } else if (w == 4) {
            *(int *)p = _mm_cvtsi128_si32(res);
          } else {
            _mm_storel_epi64(p, res);
          }
        }
      }
    }
  }
}